

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channelout.cpp
# Opt level: O2

int anon_unknown.dwarf_22b2f::ChannelOut_localcontrol(lua_State *L)

{
  int iVar1;
  int iVar2;
  ChannelOut *this;
  int xs_2;
  
  this = getChannelOut(L,1);
  iVar1 = this->index;
  iVar2 = lua_toboolean(L,2);
  xs_2 = 0x7f;
  if (iVar2 == 0) {
    xs_2 = 0;
  }
  ChannelOut::send<int,int,int>(this,iVar1 + 0xb0,0x7a,xs_2);
  lua_settop(L,1);
  return 1;
}

Assistant:

int ChannelOut_localcontrol(lua_State *L) {
	auto &self = getChannelOut(L, 1);
	self.send(0xB0 + self.index, 0x7A, lua_toboolean(L, 2) ? 0x7F : 0x00);
	lua_settop(L, 1);
	return 1;
}